

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

Aig_Man_t * Aig_ManCreateDualOutputMiter(Aig_Man_t *p1,Aig_Man_t *p2)

{
  void *pvVar1;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  
  if (p1->nObjs[2] != p2->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p1) == Aig_ManCiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress2.c"
                  ,0x57,"Aig_Man_t *Aig_ManCreateDualOutputMiter(Aig_Man_t *, Aig_Man_t *)");
  }
  if (p1->nObjs[3] != p2->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(p1) == Aig_ManCoNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress2.c"
                  ,0x58,"Aig_Man_t *Aig_ManCreateDualOutputMiter(Aig_Man_t *, Aig_Man_t *)");
  }
  p = Aig_ManStart(p2->vObjs->nSize + p1->vObjs->nSize);
  p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar4 = p1->vCis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      pAVar2 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
      lVar7 = lVar7 + 1;
      pVVar4 = p1->vCis;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = p1->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002ab3b3;
        uVar3 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar2 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar2 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        uVar3 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        pAVar2 = Aig_And(p,pAVar2,pAVar6);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
      }
      lVar7 = lVar7 + 1;
      pVVar4 = p1->vObjs;
    } while (lVar7 < pVVar4->nSize);
  }
  p2->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar4 = p2->vCis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      if (p->vCis->nSize <= lVar7) goto LAB_002ab394;
      *(void **)((long)pVVar4->pArray[lVar7] + 0x28) = p->vCis->pArray[lVar7];
      lVar7 = lVar7 + 1;
      pVVar4 = p2->vCis;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = p2->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002ab3b3;
        uVar3 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar2 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar2 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        uVar3 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        pAVar2 = Aig_And(p,pAVar2,pAVar6);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
      }
      lVar7 = lVar7 + 1;
      pVVar4 = p2->vObjs;
    } while (lVar7 < pVVar4->nSize);
  }
  if (0 < p1->nObjs[3]) {
    lVar7 = 0;
    do {
      if (p1->vCos->nSize <= lVar7) {
LAB_002ab394:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p1->vCos->pArray[lVar7];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_002ab3b3:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar3 = *(ulong *)((long)pvVar1 + 8);
      uVar5 = uVar3 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar2 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar2);
      if (p2->vCos->nSize <= lVar7) goto LAB_002ab394;
      pvVar1 = p2->vCos->pArray[lVar7];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_002ab3b3;
      uVar3 = *(ulong *)((long)pvVar1 + 8);
      uVar5 = uVar3 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar2 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar2);
      lVar7 = lVar7 + 1;
    } while (lVar7 < p1->nObjs[3]);
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Aig_ManCreateDualOutputMiter( Aig_Man_t * p1, Aig_Man_t * p2 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p1) == Aig_ManCiNum(p2) );
    assert( Aig_ManCoNum(p1) == Aig_ManCoNum(p2) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p1) + Aig_ManObjNumMax(p2) );
    // add first AIG
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add second AIG
    Aig_ManConst1(p2)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p2, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    Aig_ManForEachNode( p2, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the outputs
    for ( i = 0; i < Aig_ManCoNum(p1); i++ )
    {
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1, i)) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(Aig_ManCo(p2, i)) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}